

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Cluster::ParseSimpleBlock(Cluster *this,longlong block_size,longlong *pos,long *len)

{
  int iVar1;
  byte local_71;
  int lacing;
  uchar flags;
  longlong track;
  longlong result;
  long status;
  longlong avail;
  longlong total;
  IMkvReader *pReader;
  longlong block_stop;
  longlong block_start;
  long *len_local;
  longlong *pos_local;
  longlong block_size_local;
  Cluster *this_local;
  
  block_stop = *pos;
  pReader = (IMkvReader *)(*pos + block_size);
  total = (longlong)this->m_pSegment->m_pReader;
  block_start = (longlong)len;
  len_local = pos;
  pos_local = (longlong *)block_size;
  block_size_local = (longlong)this;
  iVar1 = (*((IMkvReader *)total)->_vptr_IMkvReader[1])(total,&avail,&status);
  result = (longlong)iVar1;
  this_local = (Cluster *)result;
  if (-1 < result) {
    if (-1 < avail && avail < status) {
      __assert_fail("(total < 0) || (avail <= total)",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1957,
                    "long mkvparser::Cluster::ParseSimpleBlock(long long, long long &, long &)");
    }
    if (status < *len_local + 1) {
      *(undefined8 *)block_start = 1;
      this_local = (Cluster *)0xfffffffffffffffd;
    }
    else {
      track = GetUIntLength((IMkvReader *)total,*len_local,(long *)block_start);
      this_local = (Cluster *)track;
      if (-1 < track) {
        if (track < 1) {
          if ((long)pReader < *len_local + *(long *)block_start) {
            this_local = (Cluster *)0xfffffffffffffffe;
          }
          else if (status < *len_local + *(long *)block_start) {
            this_local = (Cluster *)0xfffffffffffffffd;
          }
          else {
            _lacing = (Cluster *)ReadUInt((IMkvReader *)total,*len_local,(long *)block_start);
            this_local = _lacing;
            if (-1 < (long)_lacing) {
              if (_lacing == (Cluster *)0x0) {
                this_local = (Cluster *)0xfffffffffffffffe;
              }
              else {
                *len_local = *(long *)block_start + *len_local;
                if ((long)pReader < *len_local + 2) {
                  this_local = (Cluster *)0xfffffffffffffffe;
                }
                else if (status < *len_local + 2) {
                  *(undefined8 *)block_start = 2;
                  this_local = (Cluster *)0xfffffffffffffffd;
                }
                else {
                  *len_local = *len_local + 2;
                  if ((long)pReader < *len_local + 1) {
                    this_local = (Cluster *)0xfffffffffffffffe;
                  }
                  else if (status < *len_local + 1) {
                    *(undefined8 *)block_start = 1;
                    this_local = (Cluster *)0xfffffffffffffffd;
                  }
                  else {
                    iVar1 = (*(code *)**(undefined8 **)total)(total,*len_local,1,&local_71);
                    result = (longlong)iVar1;
                    if (result < 0) {
                      *(undefined8 *)block_start = 1;
                      this_local = (Cluster *)result;
                    }
                    else {
                      *len_local = *len_local + 1;
                      if (status < *len_local) {
                        __assert_fail("pos <= avail",
                                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                                      ,0x1994,
                                      "long mkvparser::Cluster::ParseSimpleBlock(long long, long long &, long &)"
                                     );
                      }
                      if (*len_local < (long)pReader) {
                        if (((int)(local_71 & 6) >> 1 == 0) || ((long)pReader <= status)) {
                          this_local = (Cluster *)
                                       CreateBlock(this,0xa3,block_stop,(longlong)pos_local,0);
                          if (this_local == (Cluster *)0x0) {
                            this->m_pos = (longlong)pReader;
                            this_local = (Cluster *)0x0;
                          }
                        }
                        else {
                          *(long *)block_start = (long)pReader - *len_local;
                          this_local = (Cluster *)0xfffffffffffffffd;
                        }
                      }
                      else {
                        this_local = (Cluster *)0xfffffffffffffffe;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          this_local = (Cluster *)0xfffffffffffffffd;
        }
      }
    }
  }
  return (long)this_local;
}

Assistant:

long Cluster::ParseSimpleBlock(long long block_size, long long& pos,
                               long& len) {
  const long long block_start = pos;
  const long long block_stop = pos + block_size;

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long total, avail;

  long status = pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  // parse track number

  if ((pos + 1) > avail) {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  long long result = GetUIntLength(pReader, pos, len);

  if (result < 0)  // error
    return static_cast<long>(result);

  if (result > 0)  // weird
    return E_BUFFER_NOT_FULL;

  if ((pos + len) > block_stop)
    return E_FILE_FORMAT_INVALID;

  if ((pos + len) > avail)
    return E_BUFFER_NOT_FULL;

  const long long track = ReadUInt(pReader, pos, len);

  if (track < 0)  // error
    return static_cast<long>(track);

  if (track == 0)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume track number

  if ((pos + 2) > block_stop)
    return E_FILE_FORMAT_INVALID;

  if ((pos + 2) > avail) {
    len = 2;
    return E_BUFFER_NOT_FULL;
  }

  pos += 2;  // consume timecode

  if ((pos + 1) > block_stop)
    return E_FILE_FORMAT_INVALID;

  if ((pos + 1) > avail) {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  unsigned char flags;

  status = pReader->Read(pos, 1, &flags);

  if (status < 0) {  // error or underflow
    len = 1;
    return status;
  }

  ++pos;  // consume flags byte
  assert(pos <= avail);

  if (pos >= block_stop)
    return E_FILE_FORMAT_INVALID;

  const int lacing = int(flags & 0x06) >> 1;

  if ((lacing != 0) && (block_stop > avail)) {
    len = static_cast<long>(block_stop - pos);
    return E_BUFFER_NOT_FULL;
  }

  status = CreateBlock(libwebm::kMkvSimpleBlock, block_start, block_size,
                       0);  // DiscardPadding

  if (status != 0)
    return status;

  m_pos = block_stop;

  return 0;  // success
}